

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O0

BranchInstr * __thiscall
LowererMDArch::InsertMissingItemCompareBranch
          (LowererMDArch *this,Opnd *compareSrc,Opnd *missingItemOpnd,OpCode opcode,
          LabelInstr *target,Instr *insertBeforeInstr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BranchInstr *pBVar4;
  RegOpnd *local_40;
  Opnd *compareSrcUint64Opnd;
  Instr *insertBeforeInstr_local;
  LabelInstr *target_local;
  OpCode opcode_local;
  Opnd *missingItemOpnd_local;
  Opnd *compareSrc_local;
  LowererMDArch *this_local;
  
  bVar2 = IR::Opnd::IsFloat64(compareSrc);
  if ((!bVar2) || (bVar2 = IR::Opnd::IsUint64(missingItemOpnd), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xd9e,"(compareSrc->IsFloat64() && missingItemOpnd->IsUint64())",
                       "compareSrc->IsFloat64() && missingItemOpnd->IsUint64()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_40 = IR::RegOpnd::New(TyUint64,this->m_func);
  bVar2 = IR::Opnd::IsRegOpnd(compareSrc);
  if (bVar2) {
    LowererMD::EmitReinterpretPrimitive
              (this->lowererMD,&local_40->super_Opnd,compareSrc,insertBeforeInstr);
  }
  else {
    bVar2 = IR::Opnd::IsIndirOpnd(compareSrc);
    if (bVar2) {
      local_40 = (RegOpnd *)IR::Opnd::UseWithNewType(compareSrc,TyUint64,this->m_func);
    }
  }
  pBVar4 = Lowerer::InsertCompareBranch
                     (this->lowererMD->m_lowerer,missingItemOpnd,&local_40->super_Opnd,opcode,target
                      ,insertBeforeInstr,false);
  return pBVar4;
}

Assistant:

IR::BranchInstr*
LowererMDArch::InsertMissingItemCompareBranch(IR::Opnd* compareSrc, IR::Opnd* missingItemOpnd, Js::OpCode opcode, IR::LabelInstr* target, IR::Instr* insertBeforeInstr)
{
    Assert(compareSrc->IsFloat64() && missingItemOpnd->IsUint64());

    IR::Opnd * compareSrcUint64Opnd = IR::RegOpnd::New(TyUint64, m_func);

    if (compareSrc->IsRegOpnd())
    {
        this->lowererMD->EmitReinterpretPrimitive(compareSrcUint64Opnd, compareSrc, insertBeforeInstr);
    }
    else if (compareSrc->IsIndirOpnd())
    {
        compareSrcUint64Opnd = compareSrc->UseWithNewType(TyUint64, m_func);
    }

    return this->lowererMD->m_lowerer->InsertCompareBranch(missingItemOpnd, compareSrcUint64Opnd, opcode, target, insertBeforeInstr);
}